

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O0

void __thiscall
CP::priority_queue<student,_std::less<student>_>::fixUp
          (priority_queue<student,_std::less<student>_> *this,size_t idx)

{
  bool bVar1;
  pointer piVar2;
  size_t p;
  student tmp;
  size_t idx_local;
  priority_queue<student,_std::less<student>_> *this_local;
  
  tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)idx;
  student::student((student *)&p,this->mData + idx);
  while (tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage != (pointer)0x0) {
    piVar2 = (pointer)((long)tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage - 1U >> 1);
    bVar1 = std::less<student>::operator()
                      ((less<student> *)&this->field_0x18,(student *)&p,this->mData + (long)piVar2);
    if (bVar1) break;
    student::operator=(this->mData +
                       (long)tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,this->mData + (long)piVar2);
    tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar2;
  }
  student::operator=(this->mData +
                     (long)tmp.scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(student *)&p);
  student::~student((student *)&p);
  return;
}

Assistant:

void fixUp(size_t idx) {
      T tmp = mData[idx];
      while (idx > 0) {
        size_t p = (idx - 1) / 2;
        if ( mLess(tmp,mData[p]) ) break;
        mData[idx] = mData[p];
        idx = p;
      }
      mData[idx] = tmp;
    }